

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O0

void r8vec2_print(int n,double *a1,double *a2,string *title)

{
  _Setw _Var1;
  ostream *poVar2;
  int local_2c;
  int i;
  string *title_local;
  double *a2_local;
  double *a1_local;
  int n_local;
  
  std::operator<<((ostream *)&std::cout,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)title);
  std::operator<<(poVar2,"\n");
  std::operator<<((ostream *)&std::cout,"\n");
  for (local_2c = 0; local_2c <= n + -1; local_2c = local_2c + 1) {
    _Var1 = std::setw(6);
    poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_2c);
    poVar2 = std::operator<<(poVar2,": ");
    _Var1 = std::setw(0xe);
    poVar2 = std::operator<<(poVar2,_Var1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,a1[local_2c]);
    poVar2 = std::operator<<(poVar2,"  ");
    _Var1 = std::setw(0xe);
    poVar2 = std::operator<<(poVar2,_Var1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,a2[local_2c]);
    std::operator<<(poVar2,"\n");
  }
  return;
}

Assistant:

void r8vec2_print ( int n, double a1[], double a2[], std::string title )

//****************************************************************************80
//
//  Purpose:
//
//    R8VEC2_PRINT prints an R8VEC2.
//
//  Discussion:
//
//    An R8VEC2 is a dataset consisting of N pairs of real values, stored
//    as two separate vectors A1 and A2.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    19 November 2002
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of components of the vector.
//
//    Input, double A1[N], double A2[N], the vectors to be printed.
//
//    Input, string TITLE, a title.
//
{
  int i;

  std::cout << "\n";
  std::cout << title << "\n";
  std::cout << "\n";
  for ( i = 0; i <= n - 1; i++ )
  {
    std::cout << std::setw(6)  << i
         << ": " << std::setw(14) << a1[i]
         << "  " << std::setw(14) << a2[i] << "\n";
  }

  return;
}